

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptint.c
# Opt level: O3

int POPT_fprintf(FILE *stream,char *format,...)

{
  char *pcVar1;
  char in_AL;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  size_t sVar7;
  char *__s;
  size_t sVar8;
  int *piVar9;
  size_t sVar10;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint *extraout_RDX;
  ulong uVar11;
  char *pcVar12;
  undefined8 in_R8;
  undefined8 in_R9;
  char **__maxlen;
  ulong uVar13;
  long lVar14;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *pout;
  char *pin;
  size_t ib;
  va_list ap;
  char *local_140;
  iconv_t local_138;
  char *local_130;
  FILE *local_128;
  size_t local_120;
  size_t local_118;
  char *local_110;
  undefined8 local_108;
  char **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pcVar4 = (char *)malloc(2);
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  __maxlen = (char **)0x1;
  local_128 = (FILE *)stream;
  do {
    local_f8 = local_e8;
    local_108 = 0x3000000010;
    pcVar12 = (char *)__maxlen;
    local_100 = &pout;
    uVar2 = vsnprintf(pcVar4,(size_t)__maxlen,format,&local_108);
    if ((int)uVar2 < 0) {
      ppcVar5 = (char **)0x64;
      if ((char **)0x64 < __maxlen) {
        ppcVar5 = __maxlen;
      }
      __maxlen = (char **)((long)__maxlen + (long)ppcVar5);
    }
    else {
      ppcVar5 = (char **)(ulong)uVar2;
      if (ppcVar5 < __maxlen) {
        pcVar6 = nl_langinfo(0xe);
        if (pcVar6 != (char *)0x0) {
          pcVar12 = "UTF-8";
          iVar3 = strcmp(pcVar6,"UTF-8");
          if (iVar3 != 0) {
            pcVar12 = "UTF-8";
            local_138 = iconv_open(pcVar6,"UTF-8");
            if (local_138 != (iconv_t)0xffffffffffffffff) {
              sVar7 = strlen(pcVar4);
              __s = (char *)malloc(sVar7 + 1);
              local_140 = __s;
              local_130 = pcVar4;
              local_120 = sVar7;
              local_118 = sVar7;
              if (__s == (char *)0x0) {
LAB_00107ba1:
                iconv_close(local_138);
                iVar3 = fprintf(local_128,"%s",pcVar4);
LAB_00107b7d:
                free(pcVar4);
                return iVar3;
              }
              iconv(local_138,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
              local_110 = (char *)0x0;
              pcVar12 = __s;
              while( true ) {
                *pcVar12 = '\0';
                pcVar12 = (char *)&local_130;
                ppcVar5 = &local_140;
                sVar8 = iconv(local_138,(char **)pcVar12,&local_118,ppcVar5,&local_120);
                if (sVar8 == 0xffffffffffffffff) {
                  piVar9 = __errno_location();
                  pcVar6 = __s;
                  do {
                    pcVar1 = local_140;
                    __s = pcVar6;
                    if (*piVar9 != 7) goto LAB_00107bc8;
                    __s = (char *)realloc(pcVar6,sVar7 * 2 + 1);
                    if (__s == (char *)0x0) {
                      free(pcVar6);
                      goto LAB_00107ba1;
                    }
                    sVar7 = sVar7 * 2;
                    lVar14 = (long)pcVar1 - (long)pcVar6;
                    local_140 = __s + lVar14;
                    local_120 = sVar7 - lVar14;
                    __s[lVar14] = '\0';
                    pcVar12 = (char *)&local_130;
                    ppcVar5 = &local_140;
                    sVar8 = iconv(local_138,(char **)pcVar12,&local_118,ppcVar5,&local_120);
                    pcVar6 = __s;
                  } while (sVar8 == 0xffffffffffffffff);
                }
                if (local_110 != (char *)0x0) break;
                local_110 = local_130;
                local_130 = (char *)0x0;
                local_118 = 0;
                pcVar12 = local_140;
              }
LAB_00107bc8:
              iconv_close(local_138);
              *local_140 = '\0';
              sVar7 = strlen(__s);
              sVar7 = sVar7 + 1;
              pcVar6 = (char *)malloc(sVar7);
              uVar2 = (uint)sVar7;
              if (pcVar6 != (char *)0x0) {
                strcpy(pcVar6,__s);
                free(__s);
LAB_00107b5d:
                iVar3 = fprintf(local_128,"%s",pcVar6);
                free(pcVar6);
                goto LAB_00107b7d;
              }
LAB_00107c10:
              POPT_fprintf_cold_1();
              iVar3 = -10;
              if ((char **)pcVar12 != (char **)0x0 && 0 < (int)uVar2) {
                sVar7 = (long)(int)uVar2 * 8 + 8;
                uVar11 = (ulong)uVar2;
                uVar13 = 0;
                sVar8 = sVar7;
                do {
                  if (*(char **)((long)pcVar12 + uVar13 * 8) == (char *)0x0) {
                    return -10;
                  }
                  sVar10 = strlen(*(char **)((long)pcVar12 + uVar13 * 8));
                  sVar8 = sVar8 + sVar10 + 1;
                  uVar13 = uVar13 + 1;
                } while (uVar11 != uVar13);
                pcVar4 = (char *)malloc(sVar8);
                if (pcVar4 == (char *)0x0) {
                  iVar3 = -0x15;
                }
                else {
                  pcVar6 = pcVar4 + sVar7;
                  pcVar4[sVar7] = '\0';
                  uVar13 = 0;
                  do {
                    *(char **)(pcVar4 + uVar13 * 8) = pcVar6;
                    pcVar6 = stpcpy(pcVar6,*(char **)((long)pcVar12 + uVar13 * 8));
                    pcVar6 = pcVar6 + 1;
                    uVar13 = uVar13 + 1;
                  } while (uVar11 != uVar13);
                  pcVar12 = pcVar4 + uVar11 * 8;
                  pcVar12[0] = '\0';
                  pcVar12[1] = '\0';
                  pcVar12[2] = '\0';
                  pcVar12[3] = '\0';
                  pcVar12[4] = '\0';
                  pcVar12[5] = '\0';
                  pcVar12[6] = '\0';
                  pcVar12[7] = '\0';
                  if (ppcVar5 == (char **)0x0) {
                    free(pcVar4);
                  }
                  else {
                    *ppcVar5 = pcVar4;
                  }
                  iVar3 = 0;
                  if (extraout_RDX != (uint *)0x0) {
                    *extraout_RDX = uVar2;
                    iVar3 = 0;
                  }
                }
              }
              return iVar3;
            }
          }
        }
        sVar7 = strlen(pcVar4);
        sVar7 = sVar7 + 1;
        pcVar6 = (char *)malloc(sVar7);
        uVar2 = (uint)sVar7;
        if (pcVar6 != (char *)0x0) {
          strcpy(pcVar6,pcVar4);
          goto LAB_00107b5d;
        }
        POPT_fprintf_cold_2();
        goto LAB_00107c10;
      }
      __maxlen = (char **)(ulong)(uVar2 + 1);
    }
    pcVar4 = (char *)realloc(pcVar4,(long)__maxlen + 1);
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

int
POPT_fprintf (FILE * stream, const char * format, ...)
{
    char * b = NULL, * ob = NULL;
    int rc;
    va_list ap;

#if defined(HAVE_VASPRINTF)
    va_start(ap, format);
    if ((rc = vasprintf(&b, format, ap)) < 0)
	b = NULL;
    va_end(ap);
#else
    size_t nb = (size_t)1;

    /* HACK: add +1 to the realloc no. of bytes "just in case". */
    /* XXX Likely unneeded, the issues wrto vsnprintf(3) return b0rkage have
     * to do with whether the final '\0' is counted (or not). The code
     * below already adds +1 for the (possibly already counted) trailing NUL.
     */
    while ((b = realloc(b, nb+1)) != NULL) {
	va_start(ap, format);
	rc = vsnprintf(b, nb, format, ap);
	va_end(ap);
	if (rc > -1) {	/* glibc 2.1 */
	    if ((size_t)rc < nb)
		break;
	    nb = (size_t)(rc + 1);	/* precise buffer length known */
	} else 		/* glibc 2.0 */
	    nb += (nb < (size_t)100 ? (size_t)100 : nb);
	ob = b;
    }
#endif

    rc = 0;
    if (b != NULL) {
#ifdef HAVE_ICONV
	ob = strdup_locale_from_utf8(b);
	if (ob != NULL) {
	    rc = fprintf(stream, "%s", ob);
	    free(ob);
	} else
#endif
	    rc = fprintf(stream, "%s", b);
	free (b);
    }

    return rc;
}